

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int decrypt_packet(ptls_cipher_context_t *header_protection,
                  _func_int_void_ptr_uint64_t_quicly_decoded_packet_t_ptr_size_t_size_t_ptr *aead_cb
                  ,void *aead_ctx,uint64_t *next_expected_pn,quicly_decoded_packet_t *packet,
                  uint64_t *pn,ptls_iovec_t *payload)

{
  byte bVar1;
  size_t sVar2;
  ulong newly_decrypted_key_phase;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  uint64_t uVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  uint32_t truncated;
  quicly_conn_t *conn;
  uint8_t hpmask [5];
  size_t local_38;
  
  if ((packet->decrypted).pn == 0xffffffffffffffff) {
    hpmask[4] = '\0';
    hpmask[0] = '\0';
    hpmask[1] = '\0';
    hpmask[2] = '\0';
    hpmask[3] = '\0';
    if ((packet->octets).len - packet->encrypted_off < header_protection->algo->iv_size + 4) {
      *pn = 0xffffffffffffffff;
      return 0xff01;
    }
    (*header_protection->do_init)
              (header_protection,(packet->octets).base + packet->encrypted_off + 4);
    (*header_protection->do_transform)(header_protection,hpmask,hpmask,5);
    pbVar6 = (packet->octets).base;
    bVar1 = *pbVar6;
    *pbVar6 = ((byte)~bVar1 >> 3 | 0xf) & hpmask[0] ^ bVar1;
    pbVar6 = (packet->octets).base;
    lVar10 = (ulong)(*pbVar6 & 3) + 1;
    truncated = 0;
    for (lVar8 = 0; lVar10 != lVar8; lVar8 = lVar8 + 1) {
      pbVar6[lVar8 + packet->encrypted_off] =
           pbVar6[lVar8 + packet->encrypted_off] ^ hpmask[lVar8 + 1];
      pbVar6 = (packet->octets).base;
      truncated = truncated << 8 | (uint)pbVar6[lVar8 + packet->encrypted_off];
    }
    sVar9 = packet->encrypted_off + lVar10;
    uVar7 = quicly_determine_packet_number
                      (truncated,(ulong)(uint)((int)lVar10 << 3),*next_expected_pn);
    *pn = uVar7;
    iVar4 = (*aead_cb)(aead_ctx,uVar7,packet,sVar9,&local_38);
    if (iVar4 != 0) {
      return iVar4;
    }
    if (*next_expected_pn <= *pn) {
      *next_expected_pn = *pn + 1;
    }
    payload->base = (packet->octets).base + sVar9;
    payload->len = local_38;
  }
  else {
    sVar9 = (packet->octets).len;
    sVar2 = packet->encrypted_off;
    payload->base = (packet->octets).base + sVar2;
    payload->len = sVar9 - sVar2;
    uVar5 = (packet->decrypted).pn;
    *pn = uVar5;
    if ((aead_cb == aead_decrypt_1rtt) &&
       (newly_decrypted_key_phase = (packet->decrypted).key_phase,
       *(ulong *)(*(long *)((long)aead_ctx + 0x540) + 0xb0) < newly_decrypted_key_phase)) {
      iVar4 = received_key_update((quicly_conn_t *)aead_ctx,newly_decrypted_key_phase);
      if (iVar4 != 0) {
        return iVar4;
      }
      uVar5 = *pn;
    }
    if (*next_expected_pn < uVar5) {
      *next_expected_pn = uVar5 + 1;
    }
  }
  bVar1 = *(packet->octets).base;
  bVar3 = 0xc;
  if (-1 < (char)bVar1) {
    bVar3 = 0x18;
  }
  iVar4 = 0x2000a;
  if ((bVar3 & bVar1) == 0) {
    iVar4 = 0x2000a;
    if (payload->len != 0) {
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int decrypt_packet(ptls_cipher_context_t *header_protection,
                          int (*aead_cb)(void *, uint64_t, quicly_decoded_packet_t *, size_t, size_t *), void *aead_ctx,
                          uint64_t *next_expected_pn, quicly_decoded_packet_t *packet, uint64_t *pn, ptls_iovec_t *payload)
{
    int ret;

    /* decrypt ourselves, or use the pre-decrypted input */
    if (packet->decrypted.pn == UINT64_MAX) {
        if ((ret = do_decrypt_packet(header_protection, aead_cb, aead_ctx, next_expected_pn, packet, pn, payload)) != 0)
            return ret;
    } else {
        *payload = ptls_iovec_init(packet->octets.base + packet->encrypted_off, packet->octets.len - packet->encrypted_off);
        *pn = packet->decrypted.pn;
        if (aead_cb == aead_decrypt_1rtt) {
            quicly_conn_t *conn = aead_ctx;
            if (conn->application->cipher.ingress.key_phase.decrypted < packet->decrypted.key_phase) {
                if ((ret = received_key_update(conn, packet->decrypted.key_phase)) != 0)
                    return ret;
            }
        }
        if (*next_expected_pn < *pn)
            *next_expected_pn = *pn + 1;
    }

    /* check reserved bits after AEAD decryption */
    if ((packet->octets.base[0] & (QUICLY_PACKET_IS_LONG_HEADER(packet->octets.base[0]) ? QUICLY_LONG_HEADER_RESERVED_BITS
                                                                                        : QUICLY_SHORT_HEADER_RESERVED_BITS)) !=
        0) {
        if (QUICLY_DEBUG)
            fprintf(stderr, "%s: non-zero reserved bits (pn: %" PRIu64 ")\n", __FUNCTION__, *pn);
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
    }
    if (payload->len == 0) {
        if (QUICLY_DEBUG)
            fprintf(stderr, "%s: payload length is zero (pn: %" PRIu64 ")\n", __FUNCTION__, *pn);
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
    }

    if (QUICLY_DEBUG) {
        char *payload_hex = quicly_hexdump(payload->base, payload->len, 4);
        fprintf(stderr, "%s: AEAD payload:\n%s", __FUNCTION__, payload_hex);
        free(payload_hex);
    }

    return 0;
}